

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::SolverParameter::SolverParameter(SolverParameter *this,SolverParameter *from)

{
  void *pvVar1;
  uint uVar2;
  NetParameter *pNVar3;
  NetState *this_00;
  long lVar4;
  int32 *piVar5;
  int32 *piVar6;
  byte bVar7;
  
  bVar7 = 0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SolverParameter_0075f870;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  *(undefined8 *)(this->_has_bits_).has_bits_ = *(undefined8 *)(from->_has_bits_).has_bits_;
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->test_net_,&from->test_net_);
  google::protobuf::RepeatedField<int>::RepeatedField(&this->test_iter_,&from->test_iter_);
  google::protobuf::RepeatedPtrField<caffe::NetParameter>::RepeatedPtrField
            (&this->test_net_param_,&from->test_net_param_);
  google::protobuf::RepeatedPtrField<caffe::NetState>::RepeatedPtrField
            (&this->test_state_,&from->test_state_);
  google::protobuf::RepeatedField<int>::RepeatedField(&this->stepvalue_,&from->stepvalue_);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->train_net_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->train_net_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->train_net_).ptr_);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->lr_policy_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 2) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->lr_policy_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->lr_policy_).ptr_);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->snapshot_prefix_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->snapshot_prefix_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->snapshot_prefix_).ptr_);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->net_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 8) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->net_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->net_).ptr_);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->regularization_type_).ptr_ = (string *)&_default_regularization_type__abi_cxx11_;
  if ((uVar2 & 0x10) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->regularization_type_,(string *)&_default_regularization_type__abi_cxx11_,
               (from->regularization_type_).ptr_);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->type_).ptr_ = (string *)&_default_type__abi_cxx11_;
  if ((uVar2 & 0x20) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->type_,(string *)&_default_type__abi_cxx11_,(from->type_).ptr_);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 & 0x40) == 0) {
    this->train_net_param_ = (NetParameter *)0x0;
  }
  else {
    pNVar3 = (NetParameter *)operator_new(0xa0);
    NetParameter::NetParameter(pNVar3,from->train_net_param_);
    this->train_net_param_ = pNVar3;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((char)uVar2 < '\0') {
    pNVar3 = (NetParameter *)operator_new(0xa0);
    NetParameter::NetParameter(pNVar3,from->net_param_);
    this->net_param_ = pNVar3;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  else {
    this->net_param_ = (NetParameter *)0x0;
  }
  if ((uVar2 >> 8 & 1) == 0) {
    this_00 = (NetState *)0x0;
  }
  else {
    this_00 = (NetState *)operator_new(0x38);
    NetState::NetState(this_00,from->train_state_);
  }
  this->train_state_ = this_00;
  piVar5 = &from->test_interval_;
  piVar6 = &this->test_interval_;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)piVar6 = *(undefined8 *)piVar5;
    piVar5 = piVar5 + (ulong)bVar7 * -4 + 2;
    piVar6 = piVar6 + (ulong)bVar7 * -4 + 2;
  }
  return;
}

Assistant:

SolverParameter::SolverParameter(const SolverParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      test_net_(from.test_net_),
      test_iter_(from.test_iter_),
      test_net_param_(from.test_net_param_),
      test_state_(from.test_state_),
      stepvalue_(from.stepvalue_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  train_net_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_train_net()) {
    train_net_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.train_net_);
  }
  lr_policy_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_lr_policy()) {
    lr_policy_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.lr_policy_);
  }
  snapshot_prefix_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_snapshot_prefix()) {
    snapshot_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.snapshot_prefix_);
  }
  net_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_net()) {
    net_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.net_);
  }
  regularization_type_.UnsafeSetDefault(&SolverParameter::_default_regularization_type_.get());
  if (from.has_regularization_type()) {
    regularization_type_.AssignWithDefault(&SolverParameter::_default_regularization_type_.get(), from.regularization_type_);
  }
  type_.UnsafeSetDefault(&SolverParameter::_default_type_.get());
  if (from.has_type()) {
    type_.AssignWithDefault(&SolverParameter::_default_type_.get(), from.type_);
  }
  if (from.has_train_net_param()) {
    train_net_param_ = new ::caffe::NetParameter(*from.train_net_param_);
  } else {
    train_net_param_ = NULL;
  }
  if (from.has_net_param()) {
    net_param_ = new ::caffe::NetParameter(*from.net_param_);
  } else {
    net_param_ = NULL;
  }
  if (from.has_train_state()) {
    train_state_ = new ::caffe::NetState(*from.train_state_);
  } else {
    train_state_ = NULL;
  }
  ::memcpy(&test_interval_, &from.test_interval_,
    reinterpret_cast<char*>(&rms_decay_) -
    reinterpret_cast<char*>(&test_interval_) + sizeof(rms_decay_));
  // @@protoc_insertion_point(copy_constructor:caffe.SolverParameter)
}